

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.h
# Opt level: O3

unsigned_t __kmp_dispatch_guided_remaining<unsigned_int>(uint tc,floating_t base,unsigned_t idx)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 local_10;
  
  dVar1 = 1.0;
  if (idx != 0) {
    uVar4 = (ulong)idx;
    dVar2 = 1.0;
    do {
      dVar1 = dVar2 * base;
      if ((uVar4 & 1) == 0) {
        dVar1 = dVar2;
      }
      base = base * base;
      uVar3 = (uint)uVar4;
      uVar4 = uVar4 >> 1;
      dVar2 = dVar1;
    } while (1 < uVar3);
  }
  uVar4 = (ulong)ROUND((double)tc * dVar1);
  local_10 = (int)uVar4;
  return (uint)((double)tc * dVar1 != (double)(uVar4 & 0xffffffff)) + local_10;
}

Assistant:

static __inline typename traits_t<T>::unsigned_t
__kmp_dispatch_guided_remaining(T tc, typename traits_t<T>::floating_t base,
                                typename traits_t<T>::unsigned_t idx) {
  /* Note: On Windows* OS on IA-32 architecture and Intel(R) 64, at
     least for ICL 8.1, long double arithmetic may not really have
     long double precision, even with /Qlong_double.  Currently, we
     workaround that in the caller code, by manipulating the FPCW for
     Windows* OS on IA-32 architecture.  The lack of precision is not
     expected to be a correctness issue, though.
  */
  typedef typename traits_t<T>::unsigned_t UT;

  long double x = tc * __kmp_pow<UT>(base, idx);
  UT r = (UT)x;
  if (x == r)
    return r;
  return r + 1;
}